

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluka_reader.cpp
# Opt level: O3

void leggi_bene(ifstream *in,char *da_cercare,char *buff,istringstream *is)

{
  char *pcVar1;
  ostream *poVar2;
  long lVar3;
  allocator local_41;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  lVar3 = *(long *)(*(long *)in + -0x18);
  do {
    std::ios::widen((char)lVar3 + (char)in);
    std::istream::getline((char *)in,(long)buff,'\x01');
    pcVar1 = strstr(buff,da_cercare);
    if (pcVar1 != (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(*(long *)is + -0x18) + (int)is);
      std::__cxx11::string::string((string *)local_40,buff,&local_41);
      std::__cxx11::stringbuf::str((string *)(is + 0x10));
      if (local_40[0] != local_30) {
        operator_delete(local_40[0]);
      }
      return;
    }
    lVar3 = *(long *)(*(long *)in + -0x18);
  } while (((byte)in[lVar3 + 0x20] & 2) == 0);
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_2389);
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(0xfa);
}

Assistant:

void leggi_bene(ifstream &in, const char * da_cercare, char * buff, istringstream &is)
{
	while(1)
	{
		in.getline(buff, 1025);
		if(strstr(buff, da_cercare)) break;

		if(in.eof())
		{
			cout << "questo file è una ciofeca" << endl;
			exit(250);
		}
	}

	is.clear();
	is.str(buff);
}